

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_zlib_decompress
               (uchar **out,size_t *outsize,uchar *in,size_t insize,
               LodePNGDecompressSettings *settings)

{
  uint uVar1;
  undefined1 auStack_48 [4];
  uint error;
  ucvector v;
  LodePNGDecompressSettings *settings_local;
  size_t insize_local;
  uchar *in_local;
  size_t *outsize_local;
  uchar **out_local;
  
  v.allocsize = (size_t)settings;
  ucvector_init((ucvector *)auStack_48,*out,*outsize);
  uVar1 = lodepng_zlib_decompressv
                    ((ucvector *)auStack_48,in,insize,(LodePNGDecompressSettings *)v.allocsize);
  *out = _auStack_48;
  *outsize = (size_t)v.data;
  return uVar1;
}

Assistant:

unsigned lodepng_zlib_decompress(unsigned char** out, size_t* outsize, const unsigned char* in,
                                 size_t insize, const LodePNGDecompressSettings* settings) {
  ucvector v = ucvector_init(*out, *outsize);
  unsigned error = lodepng_zlib_decompressv(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}